

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

bool __thiscall RenX::Server::disarmC4(Server *this,int id)

{
  ssize_t sVar1;
  size_t in_RCX;
  bool bVar2;
  int in_R8D;
  string local_30;
  
  if (this->m_competitive == false) {
    string_printf_abi_cxx11_(&local_30,"disarmc4 pid%d",id);
    sVar1 = send(this,(int)local_30._M_string_length,local_30._M_dataplus._M_p,in_RCX,in_R8D);
    bVar2 = 0 < (int)sVar1;
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RenX::Server::disarmC4(int id) {
	return m_competitive == false && send(string_printf("disarmc4 pid%d", id)) > 0;
}